

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O2

void exp_consttime_precomp
               (uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,uint64_t *b,
               uint64_t *res)

{
  uint32_t len;
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint32_t l;
  long lVar4;
  uint32_t i0;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t i;
  uint64_t *t11;
  uint64_t *ctx_r2;
  uint64_t resM [64];
  uint64_t tmp0 [64];
  uint64_t aM [64];
  uint64_t aM_1 [64];
  uint64_t local_2438 [64];
  uint64_t table [1024];
  uint64_t tmp [64];
  uint64_t *puVar5;
  
  if (bBits < 200) {
    memset(aM_1,0,0x200);
    to(n,mu,r2,a,aM_1);
    memset(aM,0,0x200);
    memcpy(table,n,0x200);
    memcpy(table + 0x40,r2,0x200);
    from(table,mu,table + 0x40,aM);
    uVar1 = 0;
    for (uVar6 = 0; uVar6 != bBits; uVar6 = uVar6 + 1) {
      uVar8 = (ulong)((b[~uVar6 + bBits >> 6] >> ((ulong)(~uVar6 + bBits) & 0x3f) & 1) != 0);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        uVar7 = (aM_1[lVar4] ^ aM[lVar4]) & -(uVar1 ^ uVar8);
        aM[lVar4] = aM[lVar4] ^ uVar7;
        aM_1[lVar4] = uVar7 ^ aM_1[lVar4];
      }
      amont_mul(table,mu,aM_1,aM,aM_1);
      amont_sqr(table,mu,aM,aM);
      uVar1 = uVar8;
    }
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      uVar8 = (aM_1[lVar4] ^ aM[lVar4]) & -uVar1;
      aM[lVar4] = aM[lVar4] ^ uVar8;
      aM_1[lVar4] = uVar8 ^ aM_1[lVar4];
    }
    puVar5 = aM;
  }
  else {
    memset(aM,0,0x200);
    to(n,mu,r2,a,aM);
    memset(resM,0,0x200);
    len = (bBits - 1 >> 6) + 1;
    memcpy(aM_1,n,0x200);
    memcpy(local_2438,r2,0x200);
    memset(table,0,0x2000);
    memset(tmp,0,0x200);
    from(aM_1,mu,local_2438,table);
    memcpy(table + 0x40,aM,0x200);
    amont_sqr(aM_1,mu,table + 0x40,tmp);
    puVar5 = table + 0x80;
    memcpy(puVar5,tmp,0x200);
    amont_mul(aM_1,mu,aM,puVar5,tmp);
    memcpy(table + 0xc0,tmp,0x200);
    amont_sqr(aM_1,mu,puVar5,tmp);
    puVar5 = table + 0x100;
    memcpy(puVar5,tmp,0x200);
    amont_mul(aM_1,mu,aM,puVar5,tmp);
    memcpy(table + 0x140,tmp,0x200);
    amont_sqr(aM_1,mu,table + 0xc0,tmp);
    memcpy(table + 0x180,tmp,0x200);
    amont_mul(aM_1,mu,aM,table + 0x180,tmp);
    memcpy(table + 0x1c0,tmp,0x200);
    amont_sqr(aM_1,mu,puVar5,tmp);
    memcpy(table + 0x200,tmp,0x200);
    amont_mul(aM_1,mu,aM,table + 0x200,tmp);
    memcpy(table + 0x240,tmp,0x200);
    amont_sqr(aM_1,mu,table + 0x140,tmp);
    memcpy(table + 0x280,tmp,0x200);
    amont_mul(aM_1,mu,aM,table + 0x280,tmp);
    memcpy(table + 0x2c0,tmp,0x200);
    amont_sqr(aM_1,mu,table + 0x180,tmp);
    memcpy(table + 0x300,tmp,0x200);
    amont_mul(aM_1,mu,aM,table + 0x300,tmp);
    memcpy(table + 0x340,tmp,0x200);
    amont_sqr(aM_1,mu,table + 0x1c0,tmp);
    puVar5 = table + 0x380;
    memcpy(puVar5,tmp,0x200);
    amont_mul(aM_1,mu,aM,puVar5,tmp);
    l = (uint32_t)puVar5;
    memcpy(table + 0x3c0,tmp,0x200);
    if ((bBits & 3) == 0) {
      from(aM_1,mu,local_2438,resM);
      i = bBits;
    }
    else {
      i = bBits & 0xfffffffc;
      uVar2 = Hacl_Bignum_Lib_bn_get_bits_u64(len,b,i,l);
      memcpy(resM,table,0x200);
      uVar3 = FStar_UInt64_eq_mask(uVar2,1);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x40] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,2);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x80] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,3);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0xc0] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,4);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x100] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,5);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x140] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,6);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x180] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,7);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x1c0] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,8);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x200] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,9);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x240] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,10);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x280] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,0xb);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x2c0] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,0xc);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x300] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,0xd);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x340] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,0xe);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar3 | table[lVar4 + 0x380] & uVar3;
      }
      uVar2 = FStar_UInt64_eq_mask(uVar2,0xf);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        resM[lVar4] = resM[lVar4] & ~uVar2 | table[lVar4 + 0x3c0] & uVar2;
      }
    }
    memset(tmp0,0,0x200);
    for (uVar6 = 0; uVar6 != bBits >> 2; uVar6 = uVar6 + 1) {
      amont_sqr(aM_1,mu,resM,resM);
      amont_sqr(aM_1,mu,resM,resM);
      amont_sqr(aM_1,mu,resM,resM);
      puVar5 = resM;
      amont_sqr(aM_1,mu,resM,resM);
      uVar2 = Hacl_Bignum_Lib_bn_get_bits_u64(len,b,(i - 4) + uVar6 * -4,(uint32_t)puVar5);
      memcpy(tmp0,table,0x200);
      uVar3 = FStar_UInt64_eq_mask(uVar2,1);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x40] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,2);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x80] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,3);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0xc0] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,4);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x100] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,5);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x140] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,6);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x180] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,7);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x1c0] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,8);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x200] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,9);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x240] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,10);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x280] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,0xb);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x2c0] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,0xc);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x300] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,0xd);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x340] & uVar3;
      }
      uVar3 = FStar_UInt64_eq_mask(uVar2,0xe);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar3 | table[lVar4 + 0x380] & uVar3;
      }
      uVar2 = FStar_UInt64_eq_mask(uVar2,0xf);
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        tmp0[lVar4] = tmp0[lVar4] & ~uVar2 | table[lVar4 + 0x3c0] & uVar2;
      }
      amont_mul(aM_1,mu,resM,tmp0,resM);
    }
    puVar5 = resM;
  }
  from(n,mu,puVar5,res);
  return;
}

Assistant:

static inline void
exp_consttime_precomp(
  uint32_t *n,
  uint32_t mu,
  uint32_t *r2,
  uint32_t *a,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *res
)
{
  if (bBits < 200U)
  {
    uint32_t aM[8U] = { 0U };
    to(n, mu, r2, a, aM);
    uint32_t resM[8U] = { 0U };
    uint32_t ctx[16U] = { 0U };
    memcpy(ctx, n, 8U * sizeof (uint32_t));
    memcpy(ctx + 8U, r2, 8U * sizeof (uint32_t));
    uint32_t sw = 0U;
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + 8U;
    from(ctx_n, mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 32U;
      uint32_t j = (bBits - i0 - 1U) % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      uint32_t sw1 = bit ^ sw;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t dummy = (0U - sw1) & (resM[i] ^ aM[i]);
        resM[i] = resM[i] ^ dummy;
        aM[i] = aM[i] ^ dummy;);
      uint32_t *ctx_n0 = ctx;
      amont_mul(ctx_n0, mu, aM, resM, aM);
      uint32_t *ctx_n1 = ctx;
      amont_sqr(ctx_n1, mu, resM, resM);
      sw = bit;
    }
    uint32_t sw0 = sw;
    KRML_MAYBE_FOR8(i,
      0U,
      8U,
      1U,
      uint32_t dummy = (0U - sw0) & (resM[i] ^ aM[i]);
      resM[i] = resM[i] ^ dummy;
      aM[i] = aM[i] ^ dummy;);
    from(n, mu, resM, res);
    return;
  }
  uint32_t aM[8U] = { 0U };
  to(n, mu, r2, a, aM);
  uint32_t resM[8U] = { 0U };
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 32U + 1U;
  }
  uint32_t ctx[16U] = { 0U };
  memcpy(ctx, n, 8U * sizeof (uint32_t));
  memcpy(ctx + 8U, r2, 8U * sizeof (uint32_t));
  uint32_t table[128U] = { 0U };
  uint32_t tmp[8U] = { 0U };
  uint32_t *t0 = table;
  uint32_t *t1 = table + 8U;
  uint32_t *ctx_n0 = ctx;
  uint32_t *ctx_r20 = ctx + 8U;
  from(ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, 8U * sizeof (uint32_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint32_t *t11 = table + (i + 1U) * 8U;
    uint32_t *ctx_n1 = ctx;
    amont_sqr(ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * 8U, tmp, 8U * sizeof (uint32_t));
    uint32_t *t2 = table + (2U * i + 2U) * 8U;
    uint32_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * 8U, tmp, 8U * sizeof (uint32_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i0 = bBits / 4U * 4U;
    uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i0, 4U);
    memcpy(resM, (uint32_t *)table, 8U * sizeof (uint32_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint32_t c = FStar_UInt32_eq_mask(bits_c, i1 + 1U);
      const uint32_t *res_j = table + (i1 + 1U) * 8U;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t *os = resM;
        uint32_t x = (c & res_j[i]) | (~c & resM[i]);
        os[i] = x;););
  }
  else
  {
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + 8U;
    from(ctx_n, mu, ctx_r2, resM);
  }
  uint32_t tmp0[8U] = { 0U };
  for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
  {
    KRML_MAYBE_FOR4(i,
      0U,
      4U,
      1U,
      uint32_t *ctx_n = ctx;
      amont_sqr(ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i0 - 4U;
    uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k, 4U);
    memcpy(tmp0, (uint32_t *)table, 8U * sizeof (uint32_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint32_t c = FStar_UInt32_eq_mask(bits_l, i1 + 1U);
      const uint32_t *res_j = table + (i1 + 1U) * 8U;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t *os = tmp0;
        uint32_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;););
    uint32_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, resM, tmp0, resM);
  }
  from(n, mu, resM, res);
}